

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O1

int lys_print_(lyout *out,lys_module *module,LYS_OUTFORMAT format,char *target_node)

{
  int iVar1;
  LY_ERR *pLVar2;
  
  switch(format) {
  case LYS_OUT_YANG:
    lys_switch_deviations(module);
    iVar1 = yang_print_model(out,module);
    break;
  case LYS_OUT_YIN:
    lys_switch_deviations(module);
    iVar1 = yin_print_model(out,module);
    break;
  case LYS_OUT_TREE:
    iVar1 = 0;
    goto LAB_001666d4;
  case LYS_OUT_TREE_GRPS:
    iVar1 = 1;
LAB_001666d4:
    iVar1 = tree_print_model(out,module,iVar1);
    return iVar1;
  case LYS_OUT_INFO:
    iVar1 = info_print_model(out,module,target_node);
    return iVar1;
  default:
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    ly_log(LY_LLERR,"Unknown output format.");
    return 1;
  }
  lys_switch_deviations(module);
  return iVar1;
}

Assistant:

static int
lys_print_(struct lyout *out, const struct lys_module *module, LYS_OUTFORMAT format, const char *target_node)
{
    int ret;
    int grps = 0;

    switch (format) {
    case LYS_OUT_YIN:
        lys_switch_deviations((struct lys_module *)module);
        ret = yin_print_model(out, module);
        lys_switch_deviations((struct lys_module *)module);
        break;
    case LYS_OUT_YANG:
        lys_switch_deviations((struct lys_module *)module);
        ret = yang_print_model(out, module);
        lys_switch_deviations((struct lys_module *)module);
        break;
    case LYS_OUT_TREE_GRPS:
        grps = 1;
        /* no break */
    case LYS_OUT_TREE:
        ret = tree_print_model(out, module, grps);
        break;
    case LYS_OUT_INFO:
        ret = info_print_model(out, module, target_node);
        break;
    default:
        LOGERR(LY_EINVAL, "Unknown output format.");
        ret = EXIT_FAILURE;
        break;
    }

    return ret;
}